

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorImpl<llvm::StringRef>::resize(SmallVectorImpl<llvm::StringRef> *this,size_type N)

{
  undefined8 *puVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = (ulong)(this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  if (uVar3 <= N) {
    if (N <= uVar3) {
      return;
    }
    if ((this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity < N) {
      SmallVectorTemplateBase<llvm::StringRef,_true>::grow
                (&this->super_SmallVectorTemplateBase<llvm::StringRef,_true>,N);
      uVar3 = (ulong)(this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                     Size;
    }
    pvVar2 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
    for (lVar4 = uVar3 << 4; N << 4 != lVar4; lVar4 = lVar4 + 0x10) {
      puVar1 = (undefined8 *)((long)pvVar2 + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
  }
  SmallVectorBase::set_size((SmallVectorBase *)this,N);
  return;
}

Assistant:

void resize(size_type N) {
    if (N < this->size()) {
      this->destroy_range(this->begin()+N, this->end());
      this->set_size(N);
    } else if (N > this->size()) {
      if (this->capacity() < N)
        this->grow(N);
      for (auto I = this->end(), E = this->begin() + N; I != E; ++I)
        new (&*I) T();
      this->set_size(N);
    }
  }